

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_gcd.c
# Opt level: O3

void zzExGCD(word *d,word *da,word *db,word *a,size_t n,word *b,size_t m,void *stack)

{
  word *b_00;
  word *b_01;
  word *b_02;
  word *a_00;
  word *a_01;
  byte bVar1;
  int iVar2;
  bool_t bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t shift;
  size_t n_00;
  size_t n_01;
  word wVar6;
  word *b_03;
  word *aa;
  
  b_00 = (word *)((long)stack + n * 8);
  b_01 = b_00 + m;
  b_02 = b_01 + n;
  a_00 = b_02 + m;
  a_01 = a_00 + m;
  sVar4 = m;
  if (n < m) {
    sVar4 = n;
  }
  wwSetZero(d,sVar4);
  wwSetW(da,m,1);
  wwSetZero(db,n);
  wwSetZero(a_00,m);
  wwSetW(a_01,n,1);
  sVar4 = wwLoZeroBits(a,n);
  sVar5 = wwLoZeroBits(b,m);
  shift = utilMin(2,sVar4,sVar5);
  wwCopy((word *)stack,a,n);
  wwShLo((word *)stack,n,shift);
  n_00 = wwWordSize((word *)stack,n);
  wwCopy(b_00,b,m);
  wwShLo(b_00,m,shift);
  n_01 = wwWordSize(b_00,m);
  wwCopy(b_01,(word *)stack,n_00);
  wwCopy(b_02,b_00,n_01);
  sVar4 = n_01;
  sVar5 = n_00;
  do {
    bVar1 = (byte)*b_01;
    while ((bVar1 & 1) == 0) {
      if (((*da & 1) == 0) && ((*db & 1) == 0)) {
        wwShLo(da,n_01,1);
        wwShLo(db,n_00,1);
      }
      else {
        wVar6 = zzAdd2(da,b_00,n_01);
        wwShLoCarry(da,n_01,1,wVar6);
        wVar6 = zzAdd2(db,(word *)stack,n_00);
        wwShLoCarry(db,n_00,1,wVar6);
      }
      wwShLo(b_01,sVar5,1);
      bVar1 = (byte)*b_01;
    }
    bVar1 = (byte)*b_02;
    while ((bVar1 & 1) == 0) {
      if (((*a_00 & 1) == 0) && ((*a_01 & 1) == 0)) {
        wwShLo(a_00,n_01,1);
        wwShLo(a_01,n_00,1);
      }
      else {
        wVar6 = zzAdd2(a_00,b_00,n_01);
        wwShLoCarry(a_00,n_01,1,wVar6);
        wVar6 = zzAdd2(a_01,(word *)stack,n_00);
        wwShLoCarry(a_01,n_00,1,wVar6);
      }
      wwShLo(b_02,sVar4,1);
      bVar1 = (byte)*b_02;
    }
    sVar5 = wwWordSize(b_01,sVar5);
    sVar4 = wwWordSize(b_02,sVar4);
    iVar2 = wwCmp2(b_01,sVar5,b_02,sVar4);
    if (iVar2 < 1) {
      wVar6 = zzSub2(b_02,b_01,sVar5);
      zzSubW2(b_02 + sVar5,sVar4 - sVar5,wVar6);
      wVar6 = zzAdd2(a_00,da,n_01);
      if ((wVar6 != 0) || (iVar2 = wwCmp(a_00,b_00,n_01), -1 < iVar2)) {
        zzSub2(a_00,b_00,n_01);
      }
      wVar6 = zzAdd2(a_01,db,n_00);
      b_03 = a_01;
      if (wVar6 == 0) {
        iVar2 = wwCmp(a_01,(word *)stack,n_00);
        goto joined_r0x0013486a;
      }
LAB_0013486f:
      zzSub2(b_03,(word *)stack,n_00);
    }
    else {
      wVar6 = zzSub2(b_01,b_02,sVar4);
      zzSubW2(b_01 + sVar4,sVar5 - sVar4,wVar6);
      wVar6 = zzAdd2(da,a_00,n_01);
      if ((wVar6 != 0) || (iVar2 = wwCmp(da,b_00,n_01), -1 < iVar2)) {
        zzSub2(da,b_00,n_01);
      }
      wVar6 = zzAdd2(db,a_01,n_00);
      b_03 = db;
      if (wVar6 != 0) goto LAB_0013486f;
      iVar2 = wwCmp(db,(word *)stack,n_00);
joined_r0x0013486a:
      if (-1 < iVar2) goto LAB_0013486f;
    }
    bVar3 = wwIsZero(b_02,sVar4);
    if (bVar3 != 0) {
      wwCopy(d,b_01,sVar5);
      sVar4 = wwBitSize(d,sVar5);
      wwShHi(d,shift + sVar4 + 0x3f >> 6,shift);
      return;
    }
  } while( true );
}

Assistant:

void zzExGCD(word d[], word da[], word db[], const word a[], size_t n,
	const word b[], size_t m, void* stack)
{
	register size_t s;
	register size_t nu, mv;
	// переменные в stack
	word* aa = (word*)stack;
	word* bb = aa + n;
	word* u = bb + m;
	word* v = u + n;
	word* da1 = v + m;
	word* db1 = da1 + m;
	stack = db1 + n;
	// pre
	ASSERT(wwIsDisjoint3(da, m, db, n, d, MIN2(n, m)));
	ASSERT(wwIsDisjoint2(a, n, d, MIN2(n, m)));
	ASSERT(wwIsDisjoint2(b, m, d, MIN2(n, m)));
	ASSERT(wwIsDisjoint2(a, n, da, m));
	ASSERT(wwIsDisjoint2(b, m, da, m));
	ASSERT(wwIsDisjoint2(a, n, db, n));
	ASSERT(wwIsDisjoint2(b, m, db, n));
	ASSERT(!wwIsZero(a, n) && !wwIsZero(b, m));
	// d <- 0, da <- 1, db <- 0, da1 <- 0, db1 <- 1
	wwSetZero(d, MIN2(n, m));
	wwSetW(da, m, 1);
	wwSetZero(db, n);
	wwSetZero(da1, m);
	wwSetW(db1, n, 1);
	// найти максимальное s т.ч. 2^s | a и 2^s | b
	s = utilMin(2, wwLoZeroBits(a, n), wwLoZeroBits(b, m));
	// aa <- a / 2^s, bb <- b / 2^s
	wwCopy(aa, a, n), wwShLo(aa, n, s), n = wwWordSize(aa, n);
	wwCopy(bb, b, m), wwShLo(bb, m, s), m = wwWordSize(bb, m);
	// u <- aa, v <- bb
	wwCopy(u, aa, n);
	wwCopy(v, bb, m);
	nu = n, mv = m;
	// итерации
	do
	{
		// пока u четное
		for (; u[0] % 2 == 0; wwShLo(u, nu, 1))
			if (da[0] % 2 == 0 && db[0] % 2 == 0)
			{
				// da <- da / 2, db <- db / 2
				wwShLo(da, m, 1);
				wwShLo(db, n, 1);
			}
			else
			{
				ASSERT((da[0] + bb[0]) % 2 == 0);
				ASSERT((db[0] + aa[0]) % 2 == 0);
				// da <- (da + bb) / 2, db <- (db0 + aa) / 2
				wwShLoCarry(da, m, 1, zzAdd2(da, bb, m));
				wwShLoCarry(db, n, 1, zzAdd2(db, aa, n));
			}
		// пока v четное
		for (; v[0] % 2 == 0; wwShLo(v, mv, 1))
			if (da1[0] % 2 == 0 && db1[0] % 2 == 0)
			{
				// da1 <- da1 / 2, db1 <- db1 / 2
				wwShLo(da1, m, 1);
				wwShLo(db1, n, 1);
			}
			else
			{
				ASSERT((da1[0] + bb[0]) % 2 == 0);
				ASSERT((db1[0] + aa[0]) % 2 == 0);
				// da1 <- (da1 + bb) / 2, db1 <- (db1 + aa) / 2
				wwShLoCarry(da1, m, 1, zzAdd2(da1, bb, m));
				wwShLoCarry(db1, n, 1, zzAdd2(db1, aa, n));
			}
		// нормализация
		nu = wwWordSize(u, nu);
		mv = wwWordSize(v, mv);
		// u > v?
		if (wwCmp2(u, nu, v, mv) > 0)
		{
			// u <- u - v
			zzSubW2(u + mv, nu - mv, zzSub2(u, v, mv));
			if (zzAdd2(da, da1, m) || wwCmp(da, bb, m) >= 0)
				zzSub2(da, bb, m);
			if (zzAdd2(db, db1, n) || wwCmp(db, aa, n) >= 0)
				zzSub2(db, aa, n);
		}
		else
		{
			// v <- v - u
			zzSubW2(v + nu, mv - nu, zzSub2(v, u, nu));
			if (zzAdd2(da1, da, m) || wwCmp(da1, bb, m) >= 0)
				zzSub2(da1, bb, m);
			if (zzAdd2(db1, db, n) || wwCmp(db1, aa, n) >= 0)
				zzSub2(db1, aa, n);
		}
	} while (!wwIsZero(v, mv));
	// d <- u
	wwCopy(d, u, nu);
	// d <- d * 2^s
	wwShHi(d, W_OF_B(wwBitSize(d, nu) + s), s);
	// очистка
	s = nu = mv = 0;
}